

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O3

cram_block_slice_hdr * cram_decode_slice_header(cram_fd *fd,cram_block *b)

{
  byte bVar1;
  cram_content_type cVar2;
  long lVar3;
  int iVar4;
  cram_block_slice_hdr *__ptr;
  long lVar5;
  int32_t *piVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  
  cVar2 = b->content_type;
  if ((cVar2 & ~COMPRESSION_HEADER) == MAPPED_SLICE) {
    pbVar12 = b->data;
    __ptr = (cram_block_slice_hdr *)calloc(1,0x48);
    if (__ptr != (cram_block_slice_hdr *)0x0) {
      __ptr->content_type = cVar2;
      if (cVar2 == MAPPED_SLICE) {
        bVar1 = *pbVar12;
        uVar7 = (uint)bVar1;
        lVar5 = 1;
        if ((char)bVar1 < '\0') {
          uVar11 = (uint)bVar1;
          uVar7 = (uint)pbVar12[1];
          if (bVar1 < 0xc0) {
            uVar7 = (uVar11 & 0x3f) << 8 | uVar7;
            lVar8 = 2;
          }
          else if (bVar1 < 0xe0) {
            uVar7 = (uVar11 & 0x1f) << 0x10 | uVar7 << 8 | (uint)pbVar12[2];
            lVar8 = 3;
          }
          else if (bVar1 < 0xf0) {
            uVar7 = (uVar11 & 0xf) << 0x18 | uVar7 << 0x10 | (uint)pbVar12[2] << 8 |
                    (uint)pbVar12[3];
            lVar8 = 4;
          }
          else {
            uVar7 = pbVar12[4] & 0xf |
                    (uint)pbVar12[3] << 4 | (uint)pbVar12[2] << 0xc | uVar7 << 0x14 | uVar11 << 0x1c
            ;
            lVar8 = 5;
          }
        }
        else {
          lVar8 = 1;
        }
        __ptr->ref_seq_id = uVar7;
        bVar1 = pbVar12[lVar8];
        uVar7 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar11 = (uint)bVar1;
          uVar7 = (uint)pbVar12[lVar8 + 1];
          if (bVar1 < 0xc0) {
            uVar7 = (uVar11 & 0x3f) << 8 | uVar7;
            lVar5 = 2;
          }
          else if (bVar1 < 0xe0) {
            uVar7 = (uVar11 & 0x1f) << 0x10 | uVar7 << 8 | (uint)pbVar12[lVar8 + 2];
            lVar5 = 3;
          }
          else if (bVar1 < 0xf0) {
            uVar7 = (uVar11 & 0xf) << 0x18 | uVar7 << 0x10 | (uint)pbVar12[lVar8 + 2] << 8 |
                    (uint)pbVar12[lVar8 + 3];
            lVar5 = 4;
          }
          else {
            uVar7 = pbVar12[lVar8 + 4] & 0xf |
                    (uint)pbVar12[lVar8 + 3] << 4 |
                    (uint)pbVar12[lVar8 + 2] << 0xc | uVar7 << 0x14 | uVar11 << 0x1c;
            lVar5 = 5;
          }
        }
        __ptr->ref_seq_start = uVar7;
        lVar3 = lVar5 + lVar8;
        bVar1 = pbVar12[lVar5 + lVar8];
        uVar7 = (uint)bVar1;
        lVar5 = 1;
        if ((char)bVar1 < '\0') {
          uVar11 = (uint)bVar1;
          uVar7 = (uint)pbVar12[lVar3 + 1];
          if (bVar1 < 0xc0) {
            uVar7 = (uVar11 & 0x3f) << 8 | uVar7;
            lVar5 = 2;
          }
          else if (bVar1 < 0xe0) {
            uVar7 = (uVar11 & 0x1f) << 0x10 | uVar7 << 8 | (uint)pbVar12[lVar3 + 2];
            lVar5 = 3;
          }
          else if (bVar1 < 0xf0) {
            uVar7 = (uVar11 & 0xf) << 0x18 | uVar7 << 0x10 | (uint)pbVar12[lVar3 + 2] << 8 |
                    (uint)pbVar12[lVar3 + 3];
            lVar5 = 4;
          }
          else {
            uVar7 = pbVar12[lVar3 + 4] & 0xf |
                    (uint)pbVar12[lVar3 + 3] << 4 |
                    (uint)pbVar12[lVar3 + 2] << 0xc | uVar7 << 0x14 | uVar11 << 0x1c;
            lVar5 = 5;
          }
        }
        __ptr->ref_seq_span = uVar7;
        pbVar12 = pbVar12 + lVar5 + lVar3;
      }
      bVar1 = *pbVar12;
      uVar7 = (uint)bVar1;
      lVar5 = 1;
      if ((char)bVar1 < '\0') {
        uVar11 = (uint)bVar1;
        uVar7 = (uint)pbVar12[1];
        if (bVar1 < 0xc0) {
          uVar7 = (uVar11 & 0x3f) << 8 | uVar7;
          lVar5 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar7 = (uVar11 & 0x1f) << 0x10 | uVar7 << 8 | (uint)pbVar12[2];
          lVar5 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar7 = (uVar11 & 0xf) << 0x18 | uVar7 << 0x10 | (uint)pbVar12[2] << 8 | (uint)pbVar12[3];
          lVar5 = 4;
        }
        else {
          uVar7 = pbVar12[4] & 0xf |
                  (uint)pbVar12[3] << 4 | (uint)pbVar12[2] << 0xc | uVar7 << 0x14 | uVar11 << 0x1c;
          lVar5 = 5;
        }
      }
      __ptr->num_records = uVar7;
      pbVar12 = pbVar12 + lVar5;
      iVar4 = fd->version >> 8;
      if (iVar4 == 2) {
        bVar1 = *pbVar12;
        uVar7 = (uint)bVar1;
        lVar5 = 1;
        if ((char)bVar1 < '\0') {
          uVar11 = (uint)bVar1;
          uVar7 = (uint)pbVar12[1];
          if (bVar1 < 0xc0) {
            uVar7 = (uVar11 & 0x3f) << 8 | uVar7;
            lVar5 = 2;
          }
          else if (bVar1 < 0xe0) {
            uVar7 = (uVar11 & 0x1f) << 0x10 | uVar7 << 8 | (uint)pbVar12[2];
            lVar5 = 3;
          }
          else if (bVar1 < 0xf0) {
            uVar7 = (uVar11 & 0xf) << 0x18 | uVar7 << 0x10 | (uint)pbVar12[2] << 8 |
                    (uint)pbVar12[3];
            lVar5 = 4;
          }
          else {
            uVar7 = pbVar12[4] & 0xf |
                    (uint)pbVar12[3] << 4 | (uint)pbVar12[2] << 0xc | uVar7 << 0x14 | uVar11 << 0x1c
            ;
            lVar5 = 5;
          }
        }
        pbVar12 = pbVar12 + lVar5;
        __ptr->record_counter = (long)(int)uVar7;
      }
      else if (2 < iVar4) {
        iVar4 = ltf8_get((char *)pbVar12,&__ptr->record_counter);
        pbVar12 = pbVar12 + iVar4;
      }
      bVar1 = *pbVar12;
      uVar7 = (uint)bVar1;
      lVar5 = 1;
      if ((char)bVar1 < '\0') {
        uVar11 = (uint)bVar1;
        uVar7 = (uint)pbVar12[1];
        if (bVar1 < 0xc0) {
          uVar7 = (uVar11 & 0x3f) << 8 | uVar7;
          lVar8 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar7 = (uVar11 & 0x1f) << 0x10 | uVar7 << 8 | (uint)pbVar12[2];
          lVar8 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar7 = (uVar11 & 0xf) << 0x18 | uVar7 << 0x10 | (uint)pbVar12[2] << 8 | (uint)pbVar12[3];
          lVar8 = 4;
        }
        else {
          uVar7 = pbVar12[4] & 0xf |
                  (uint)pbVar12[3] << 4 | (uint)pbVar12[2] << 0xc | uVar7 << 0x14 | uVar11 << 0x1c;
          lVar8 = 5;
        }
      }
      else {
        lVar8 = 1;
      }
      __ptr->num_blocks = uVar7;
      bVar1 = pbVar12[lVar8];
      uVar7 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar11 = (uint)bVar1;
        uVar7 = (uint)pbVar12[lVar8 + 1];
        if (bVar1 < 0xc0) {
          uVar7 = (uVar11 & 0x3f) << 8 | uVar7;
          lVar5 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar7 = (uVar11 & 0x1f) << 0x10 | uVar7 << 8 | (uint)pbVar12[lVar8 + 2];
          lVar5 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar7 = (uVar11 & 0xf) << 0x18 | uVar7 << 0x10 | (uint)pbVar12[lVar8 + 2] << 8 |
                  (uint)pbVar12[lVar8 + 3];
          lVar5 = 4;
        }
        else {
          uVar7 = pbVar12[lVar8 + 4] & 0xf |
                  (uint)pbVar12[lVar8 + 3] << 4 |
                  (uint)pbVar12[lVar8 + 2] << 0xc | uVar7 << 0x14 | uVar11 << 0x1c;
          lVar5 = 5;
        }
      }
      __ptr->num_content_ids = uVar7;
      piVar6 = (int32_t *)malloc((long)(int)uVar7 << 2);
      __ptr->block_content_ids = piVar6;
      if (piVar6 != (int32_t *)0x0) {
        pbVar12 = pbVar12 + lVar5 + lVar8;
        if (0 < (int)uVar7) {
          uVar9 = 0;
          do {
            bVar1 = *pbVar12;
            uVar11 = (uint)bVar1;
            lVar5 = 1;
            if ((char)bVar1 < '\0') {
              uVar10 = (uint)bVar1;
              uVar11 = (uint)pbVar12[1];
              if (bVar1 < 0xc0) {
                uVar11 = (uVar10 & 0x3f) << 8 | uVar11;
                lVar5 = 2;
              }
              else if (bVar1 < 0xe0) {
                uVar11 = (uVar10 & 0x1f) << 0x10 | uVar11 << 8 | (uint)pbVar12[2];
                lVar5 = 3;
              }
              else if (bVar1 < 0xf0) {
                uVar11 = (uVar10 & 0xf) << 0x18 | uVar11 << 0x10 | (uint)pbVar12[2] << 8 |
                         (uint)pbVar12[3];
                lVar5 = 4;
              }
              else {
                uVar11 = pbVar12[4] & 0xf |
                         (uint)pbVar12[3] << 4 |
                         (uint)pbVar12[2] << 0xc | uVar11 << 0x14 | uVar10 << 0x1c;
                lVar5 = 5;
              }
            }
            piVar6[uVar9] = uVar11;
            pbVar12 = pbVar12 + lVar5;
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
        if (b->content_type == MAPPED_SLICE) {
          bVar1 = *pbVar12;
          uVar7 = (uint)bVar1;
          lVar5 = 1;
          if ((char)bVar1 < '\0') {
            uVar11 = (uint)bVar1;
            uVar7 = (uint)pbVar12[1];
            if (bVar1 < 0xc0) {
              uVar7 = (uVar11 & 0x3f) << 8 | uVar7;
              lVar5 = 2;
            }
            else if (bVar1 < 0xe0) {
              uVar7 = (uVar11 & 0x1f) << 0x10 | uVar7 << 8 | (uint)pbVar12[2];
              lVar5 = 3;
            }
            else if (bVar1 < 0xf0) {
              uVar7 = (uVar11 & 0xf) << 0x18 | uVar7 << 0x10 | (uint)pbVar12[2] << 8 |
                      (uint)pbVar12[3];
              lVar5 = 4;
            }
            else {
              uVar7 = pbVar12[4] & 0xf |
                      (uint)pbVar12[3] << 4 |
                      (uint)pbVar12[2] << 0xc | uVar7 << 0x14 | uVar11 << 0x1c;
              lVar5 = 5;
            }
          }
          __ptr->ref_base_id = uVar7;
          pbVar12 = pbVar12 + lVar5;
        }
        if ((fd->version & 0xffffff00U) == 0x100) {
          uVar13 = 0;
          uVar14 = 0;
          uVar15 = 0;
          uVar16 = 0;
        }
        else {
          uVar13 = *(undefined4 *)pbVar12;
          uVar14 = *(undefined4 *)(pbVar12 + 4);
          uVar15 = *(undefined4 *)(pbVar12 + 8);
          uVar16 = *(undefined4 *)(pbVar12 + 0xc);
        }
        *(undefined4 *)__ptr->md5 = uVar13;
        *(undefined4 *)(__ptr->md5 + 4) = uVar14;
        *(undefined4 *)(__ptr->md5 + 8) = uVar15;
        *(undefined4 *)(__ptr->md5 + 0xc) = uVar16;
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (cram_block_slice_hdr *)0x0;
}

Assistant:

cram_block_slice_hdr *cram_decode_slice_header(cram_fd *fd, cram_block *b) {
    cram_block_slice_hdr *hdr;
    char *cp = (char *)b->data;
    int i;

    if (b->content_type != MAPPED_SLICE &&
	b->content_type != UNMAPPED_SLICE)
	return NULL;

    if (!(hdr  = calloc(1, sizeof(*hdr))))
	return NULL;

    hdr->content_type = b->content_type;

    if (b->content_type == MAPPED_SLICE) {
	cp += itf8_get(cp, &hdr->ref_seq_id);
	cp += itf8_get(cp, &hdr->ref_seq_start);
	cp += itf8_get(cp, &hdr->ref_seq_span);
    }
    cp += itf8_get(cp, &hdr->num_records);
    hdr->record_counter = 0;
    if (CRAM_MAJOR_VERS(fd->version) == 2) {
	int32_t i32;
	cp += itf8_get(cp, &i32);
	hdr->record_counter = i32;
    } else if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	cp += ltf8_get(cp, &hdr->record_counter);
    }

    cp += itf8_get(cp, &hdr->num_blocks);

    cp += itf8_get(cp, &hdr->num_content_ids);
    hdr->block_content_ids = malloc(hdr->num_content_ids * sizeof(int32_t));
    if (!hdr->block_content_ids) {
	free(hdr);
	return NULL;
    }

    for (i = 0; i < hdr->num_content_ids; i++) {
	cp += itf8_get(cp, &hdr->block_content_ids[i]);
    }

    if (b->content_type == MAPPED_SLICE) {
	cp += itf8_get(cp, &hdr->ref_base_id);
    }

    if (CRAM_MAJOR_VERS(fd->version) != 1) {
	memcpy(hdr->md5, cp, 16);
    } else {
	memset(hdr->md5, 0, 16);
    }

    return hdr;
}